

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O2

websocket_result * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::websocket_result>::awaitResume
          (websocket_result *__return_storage_ptr__,LazyAwaiterBase<cinatra::websocket_result> *this
          )

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ws_frame_type wVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  bool bVar11;
  undefined3 uVar12;
  websocket_result *pwVar13;
  
  pwVar13 = LazyPromise<cinatra::websocket_result>::result
                      ((LazyPromise<cinatra::websocket_result> *)
                       ((long)(this->_handle).__handle_ + 0x10));
  uVar1 = *(undefined4 *)&(pwVar13->ec).field_0x4;
  uVar2 = *(undefined4 *)&(pwVar13->ec)._M_cat;
  uVar3 = *(undefined4 *)((long)&(pwVar13->ec)._M_cat + 4);
  wVar4 = pwVar13->type;
  uVar5 = *(undefined4 *)&pwVar13->field_0x14;
  sVar10 = (pwVar13->data)._M_len;
  uVar6 = *(undefined4 *)((long)&(pwVar13->data)._M_len + 4);
  uVar7 = *(undefined4 *)&(pwVar13->data)._M_str;
  uVar8 = *(undefined4 *)((long)&(pwVar13->data)._M_str + 4);
  bVar11 = pwVar13->eof;
  uVar12 = *(undefined3 *)&pwVar13->field_0x29;
  uVar9 = *(undefined4 *)&pwVar13->field_0x2c;
  (__return_storage_ptr__->ec)._M_value = (pwVar13->ec)._M_value;
  *(undefined4 *)&(__return_storage_ptr__->ec).field_0x4 = uVar1;
  *(undefined4 *)&(__return_storage_ptr__->ec)._M_cat = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->ec)._M_cat + 4) = uVar3;
  __return_storage_ptr__->type = wVar4;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar5;
  *(int *)&(__return_storage_ptr__->data)._M_len = (int)sVar10;
  *(undefined4 *)((long)&(__return_storage_ptr__->data)._M_len + 4) = uVar6;
  *(undefined4 *)&(__return_storage_ptr__->data)._M_str = uVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->data)._M_str + 4) = uVar8;
  __return_storage_ptr__->eof = bVar11;
  *(undefined3 *)&__return_storage_ptr__->field_0x29 = uVar12;
  *(undefined4 *)&__return_storage_ptr__->field_0x2c = uVar9;
  (**(code **)((long)(this->_handle).__handle_ + 8))();
  (this->_handle).__handle_ = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }